

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QFileDialogPrivate::HistoryItem*>,long_long>
               (reverse_iterator<QFileDialogPrivate::HistoryItem_*> first,longlong n,
               reverse_iterator<QFileDialogPrivate::HistoryItem_*> d_first)

{
  undefined8 uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QPersistentModelIndex *pQVar5;
  int *piVar6;
  HistoryItem *pHVar7;
  reverse_iterator<QFileDialogPrivate::HistoryItem_*> *prVar8;
  HistoryItem *pHVar9;
  HistoryItem *pHVar10;
  HistoryItem *pHVar11;
  HistoryItem *pHVar12;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (HistoryItem *)((d_first.current)->path).d.d;
  pHVar11 = local_58.end.current + -n;
  pHVar12 = (HistoryItem *)((first.current)->path).d.d;
  pHVar9 = local_58.end.current;
  pHVar7 = pHVar11;
  pHVar10 = pHVar12;
  if (pHVar11 < pHVar12) {
    pHVar7 = pHVar12;
    pHVar10 = pHVar11;
  }
  while (pHVar9 != pHVar7) {
    uVar1 = *(undefined8 *)&pHVar12[-1].path.d.d;
    *(undefined8 *)&pHVar12[-1].path.d.d = 0;
    *(undefined8 *)&pHVar9[-1].path.d.d = uVar1;
    pcVar2 = pHVar12[-1].path.d.ptr;
    pHVar12[-1].path.d.ptr = (char16_t *)0x0;
    pHVar9[-1].path.d.ptr = pcVar2;
    qVar3 = pHVar12[-1].path.d.size;
    pHVar12[-1].path.d.size = 0;
    pHVar9[-1].path.d.size = qVar3;
    pDVar4 = pHVar12[-1].selection.d.d;
    pHVar12[-1].selection.d.d = (Data *)0x0;
    pHVar9[-1].selection.d.d = pDVar4;
    pQVar5 = pHVar12[-1].selection.d.ptr;
    pHVar12[-1].selection.d.ptr = (QPersistentModelIndex *)0x0;
    pHVar9[-1].selection.d.ptr = pQVar5;
    qVar3 = pHVar12[-1].selection.d.size;
    pHVar12[-1].selection.d.size = 0;
    pHVar9[-1].selection.d.size = qVar3;
    ((d_first.current)->path).d.d = ((d_first.current)->path).d.d + -3;
    pHVar12 = (HistoryItem *)(((first.current)->path).d.d + -3);
    ((first.current)->path).d.d = (Data *)pHVar12;
    pHVar9 = (HistoryItem *)((d_first.current)->path).d.d;
  }
  local_58.intermediate.current = pHVar9;
  while (prVar8 = &local_58.end, pHVar9 != pHVar11) {
    uVar1 = *(undefined8 *)&pHVar9[-1].path.d.d;
    *(undefined8 *)&pHVar9[-1].path.d.d = *(undefined8 *)&pHVar12[-1].path.d.d;
    *(undefined8 *)&pHVar12[-1].path.d.d = uVar1;
    pcVar2 = pHVar9[-1].path.d.ptr;
    pHVar9[-1].path.d.ptr = pHVar12[-1].path.d.ptr;
    pHVar12[-1].path.d.ptr = pcVar2;
    qVar3 = pHVar9[-1].path.d.size;
    pHVar9[-1].path.d.size = pHVar12[-1].path.d.size;
    pHVar12[-1].path.d.size = qVar3;
    QArrayDataPointer<QPersistentModelIndex>::operator=
              (&pHVar9[-1].selection.d,&pHVar12[-1].selection.d);
    ((d_first.current)->path).d.d = ((d_first.current)->path).d.d + -3;
    pHVar12 = (HistoryItem *)(((first.current)->path).d.d + -3);
    ((first.current)->path).d.d = (Data *)pHVar12;
    pHVar9 = (HistoryItem *)((d_first.current)->path).d.d;
  }
  while (local_58.iter = prVar8, pHVar12 != pHVar10) {
    ((first.current)->path).d.d = (Data *)(pHVar12 + 1);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&(pHVar12->selection).d);
    piVar6 = *(int **)&(pHVar12->path).d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pHVar12->path).d.d,2,0x10);
      }
    }
    prVar8 = local_58.iter;
    pHVar12 = (HistoryItem *)((first.current)->path).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QFileDialogPrivate::HistoryItem_*>,_long_long>
  ::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}